

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_mem xmrig::OclLib::createBuffer
                 (cl_context context,cl_mem_flags flags,size_t size,void *host_ptr,
                 cl_int *errcode_ret)

{
  char *pcVar1;
  char *pcVar2;
  void *in_RCX;
  size_t in_RDX;
  cl_mem_flags in_RSI;
  cl_context in_RDI;
  cl_int *in_R8;
  cl_mem result;
  cl_mem local_8;
  
  local_8 = (*pCreateBuffer)(in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  if (*in_R8 != 0) {
    pcVar1 = ocl_tag();
    pcVar2 = OclError::toString(*in_R8);
    Log::print(ERR,
               "%s\x1b[0;31m error \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m when calling \x1b[0m\x1b[1;31m%s\x1b[0m\x1b[0;31m with buffer size \x1b[0m\x1b[1;31m%zu\x1b[0m"
               ,pcVar1,pcVar2,kCreateBuffer,in_RDX);
    local_8 = (cl_mem)0x0;
  }
  return local_8;
}

Assistant:

cl_mem xmrig::OclLib::createBuffer(cl_context context, cl_mem_flags flags, size_t size, void *host_ptr, cl_int *errcode_ret) noexcept
{
    assert(pCreateBuffer != nullptr);

    auto result = pCreateBuffer(context, flags, size, host_ptr, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR("%s" RED(" error ") RED_BOLD("%s") RED(" when calling ") RED_BOLD("%s") RED(" with buffer size ") RED_BOLD("%zu"),
                ocl_tag(), OclError::toString(*errcode_ret), kCreateBuffer, size);

        return nullptr;
    }

    return result;
}